

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<true> *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  ParseResult PVar3;
  ClearStackOnExit scope;
  undefined4 in_stack_ffffffffffffff88;
  ParseErrorCode in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  ClearStackOnExit local_30 [2];
  GenericInsituStringStream<rapidjson::UTF8<char>_> *local_20;
  ulong local_10;
  size_t local_8;
  
  local_20 = in_RSI;
  ParseResult::Clear((ParseResult *)0x29b496);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ClearStackOnExit::ClearStackOnExit(local_30,in_RDI);
  SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (GenericInsituStringStream<rapidjson::UTF8<char>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x29b4c2);
  if (bVar1) {
    local_10 = *(ulong *)&in_RDI->parseResult_;
    local_8 = (in_RDI->parseResult_).offset_;
    goto LAB_0029b72f;
  }
  CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(local_20);
  if (CVar2 == '\0') {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(local_20);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c,0x29b569);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x29b57b);
    if (bVar1) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0029b72f;
    }
  }
  else {
    ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)CONCAT17(in_stack_ffffffffffffffa7,
                           CONCAT16(in_stack_ffffffffffffffa6,
                                    CONCAT15(in_stack_ffffffffffffffa5,
                                             CONCAT14(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0)))),
               in_stack_ffffffffffffff98,
               (VWReaderHandler<true> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x29b5de);
    if (bVar1) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0029b72f;
    }
    SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (GenericInsituStringStream<rapidjson::UTF8<char>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x29b637);
    if (bVar1) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0029b72f;
    }
    CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(local_20);
    if (CVar2 != '\0') {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(local_20);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c,0x29b6c1);
      bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x29b6d3);
      if (bVar1) {
        local_10 = *(ulong *)&in_RDI->parseResult_;
        local_8 = (in_RDI->parseResult_).offset_;
        goto LAB_0029b72f;
      }
    }
  }
  local_10 = *(ulong *)&in_RDI->parseResult_;
  local_8 = (in_RDI->parseResult_).offset_;
LAB_0029b72f:
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ClearStackOnExit::~ClearStackOnExit((ClearStackOnExit *)0x29b739);
  PVar3._0_8_ = local_10 & 0xffffffff;
  PVar3.offset_ = local_8;
  return PVar3;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler)
  { if (parseFlags & kParseIterativeFlag)
      return IterativeParse<parseFlags>(is, handler);

    parseResult_.Clear();

    ClearStackOnExit scope(*this);

    SkipWhitespaceAndComments<parseFlags>(is);
    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

    if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
    { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
    }
    else
    { ParseValue<parseFlags>(is, handler);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

      if (!(parseFlags & kParseStopWhenDoneFlag))
      { SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() != '\0'))
        { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
          RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
      }
    }

    return parseResult_;
  }